

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# abcHieNew.c
# Opt level: O3

int Au_ManMemUsageUseful(Au_Man_t *p)

{
  int iVar1;
  long lVar2;
  long lVar3;
  
  lVar2 = (long)(p->vNtks).nSize;
  iVar1 = 0;
  if (1 < lVar2) {
    iVar1 = 0;
    lVar3 = 1;
    do {
      iVar1 = iVar1 + *(int *)((long)(p->vNtks).pArray[lVar3] + 0x88) * 0x10;
      lVar3 = lVar3 + 1;
    } while (lVar2 != lVar3);
  }
  return iVar1;
}

Assistant:

int Au_ManMemUsageUseful( Au_Man_t * p )
{
    Au_Ntk_t * pNtk;
    int i, Mem = 0;
    Au_ManForEachNtk( p, pNtk, i )
        Mem += 16 * pNtk->nObjsUsed;
    return Mem;
}